

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

bool __thiscall irr::scene::CSceneManager::isCulled(CSceneManager *this,ISceneNode *node)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  EIntersectionRelation3D EVar4;
  undefined4 extraout_var;
  float *pfVar6;
  undefined4 extraout_var_01;
  long lVar7;
  SViewFrustum *other;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar8;
  s32 i;
  float fVar9;
  float fVar10;
  vector3d<float> vVar11;
  float local_1f8;
  float fStack_1f4;
  vector3df edges [8];
  matrix4 invTrans;
  aabbox3d<float> tbox;
  long *plVar5;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->super_ISceneManager)._vptr_ISceneManager[0xe])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar5 == (long *)0x0) {
    return false;
  }
  uVar3 = node->AutomaticCullingState;
  if ((uVar3 & 8) != 0) {
    iVar2 = (*this->Driver->_vptr_IVideoDriver[0x21])(this->Driver,node);
    if (iVar2 == 0) {
      return true;
    }
    uVar3 = node->AutomaticCullingState;
  }
  if ((uVar3 & 1) == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = (*node->_vptr_ISceneNode[7])(node);
    pfVar6 = (float *)CONCAT44(extraout_var_00,iVar2);
    tbox.MinEdge.X = *pfVar6;
    tbox.MinEdge.Y = pfVar6[1];
    tbox.MinEdge.Z = pfVar6[2];
    tbox.MaxEdge.X = pfVar6[3];
    tbox.MaxEdge.Y = pfVar6[4];
    tbox.MaxEdge.Z = pfVar6[5];
    iVar2 = (*node->_vptr_ISceneNode[10])(node);
    core::CMatrix4<float>::transformBoxEx((CMatrix4<float> *)CONCAT44(extraout_var_01,iVar2),&tbox);
    lVar7 = (**(code **)(*plVar5 + 0x1b0))(plVar5);
    bVar1 = core::aabbox3d<float>::intersectsWithBox(&tbox,(aabbox3d<float> *)(lVar7 + 0x6c));
    bVar1 = !bVar1;
    if (bVar1) goto LAB_001e6f2f;
  }
  if ((node->AutomaticCullingState & 4) != 0) {
    (*node->_vptr_ISceneNode[8])(&tbox,node);
    fVar9 = core::aabbox3d<float>::getRadius(&tbox);
    vVar11 = core::aabbox3d<float>::getCenter(&tbox);
    lVar7 = (**(code **)(*plVar5 + 0x1b0))(plVar5);
    fVar9 = fVar9 + *(float *)(lVar7 + 0x104);
    lVar7 = (**(code **)(*plVar5 + 0x1b0))(plVar5);
    local_1f8 = vVar11.X;
    fStack_1f4 = vVar11.Y;
    local_1f8 = local_1f8 - (float)*(undefined8 *)(lVar7 + 0x10c);
    fStack_1f4 = fStack_1f4 - (float)((ulong)*(undefined8 *)(lVar7 + 0x10c) >> 0x20);
    fVar10 = vVar11.Z - *(float *)(lVar7 + 0x114);
    bVar1 = fVar9 * fVar9 < fVar10 * fVar10 + local_1f8 * local_1f8 + fStack_1f4 * fStack_1f4;
  }
LAB_001e6f2f:
  if (bVar1) {
    return true;
  }
  if ((node->AutomaticCullingState & 2) == 0) {
    return false;
  }
  other = (SViewFrustum *)(**(code **)(*plVar5 + 0x1b0))(plVar5);
  SViewFrustum::SViewFrustum((SViewFrustum *)&tbox,other);
  iVar2 = (*node->_vptr_ISceneNode[10])(node);
  core::CMatrix4<float>::CMatrix4
            (&invTrans,(CMatrix4<float> *)CONCAT44(extraout_var_02,iVar2),EM4CONST_INVERSE);
  SViewFrustum::transform((SViewFrustum *)&tbox,&invTrans);
  edges[6].Z = 0.0;
  edges[7].X = 0.0;
  edges[7].Y = 0.0;
  edges[7].Z = 0.0;
  edges[5].Y = 0.0;
  edges[5].Z = 0.0;
  edges[6].X = 0.0;
  edges[6].Y = 0.0;
  edges[4].X = 0.0;
  edges[4].Y = 0.0;
  edges[4].Z = 0.0;
  edges[5].X = 0.0;
  edges[2].Z = 0.0;
  edges[3].X = 0.0;
  edges[3].Y = 0.0;
  edges[3].Z = 0.0;
  edges[1].Y = 0.0;
  edges[1].Z = 0.0;
  edges[2].X = 0.0;
  edges[2].Y = 0.0;
  edges[0].X = 0.0;
  edges[0].Y = 0.0;
  edges[0].Z = 0.0;
  edges[1].X = 0.0;
  iVar2 = (*node->_vptr_ISceneNode[7])(node);
  core::aabbox3d<float>::getEdges((aabbox3d<float> *)CONCAT44(extraout_var_03,iVar2),edges);
  lVar7 = 0;
  do {
    if (lVar7 == 6) {
      return false;
    }
    lVar8 = 0;
    do {
      if (lVar8 + 0xc == 0x6c) {
        return true;
      }
      EVar4 = core::plane3d<float>::classifyPointRelation
                        ((plane3d<float> *)((long)&tbox.MaxEdge + lVar7 * 0x10),
                         (vector3d<float> *)((long)&edges[0].X + lVar8));
      lVar8 = lVar8 + 0xc;
    } while (EVar4 == ISREL3D_FRONT);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

bool CSceneManager::isCulled(const ISceneNode *node) const
{
	const ICameraSceneNode *cam = getActiveCamera();
	if (!cam) {
		return false;
	}
	bool result = false;

	// has occlusion query information
	if (node->getAutomaticCulling() & scene::EAC_OCC_QUERY) {
		result = (Driver->getOcclusionQueryResult(const_cast<ISceneNode *>(node)) == 0);
	}

	// can be seen by a bounding box ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_BOX)) {
		core::aabbox3d<f32> tbox = node->getBoundingBox();
		node->getAbsoluteTransformation().transformBoxEx(tbox);
		result = !(tbox.intersectsWithBox(cam->getViewFrustum()->getBoundingBox()));
	}

	// can be seen by a bounding sphere
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_SPHERE)) {
		const core::aabbox3df nbox = node->getTransformedBoundingBox();
		const float rad = nbox.getRadius();
		const core::vector3df center = nbox.getCenter();

		const float camrad = cam->getViewFrustum()->getBoundingRadius();
		const core::vector3df camcenter = cam->getViewFrustum()->getBoundingCenter();

		const float dist = (center - camcenter).getLengthSQ();
		const float maxdist = (rad + camrad) * (rad + camrad);

		result = dist > maxdist;
	}

	// can be seen by cam pyramid planes ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_BOX)) {
		SViewFrustum frust = *cam->getViewFrustum();

		// transform the frustum to the node's current absolute transformation
		core::matrix4 invTrans(node->getAbsoluteTransformation(), core::matrix4::EM4CONST_INVERSE);
		// invTrans.makeInverse();
		frust.transform(invTrans);

		core::vector3df edges[8];
		node->getBoundingBox().getEdges(edges);

		for (s32 i = 0; i < scene::SViewFrustum::VF_PLANE_COUNT; ++i) {
			bool boxInFrustum = false;
			for (u32 j = 0; j < 8; ++j) {
				if (frust.planes[i].classifyPointRelation(edges[j]) != core::ISREL3D_FRONT) {
					boxInFrustum = true;
					break;
				}
			}

			if (!boxInFrustum) {
				result = true;
				break;
			}
		}
	}

	return result;
}